

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void get_block_level_tpl_stats
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,int *valid_refs,
               PruneInfoFromTpl *inter_cost_info_from_tpl)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int mi_col_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  int64_t cur_inter_cost;
  int ref_idx_1;
  int64_t best_inter_cost;
  int ref_idx;
  TplDepStats *this_stats;
  int col;
  int row;
  int col_step_sr;
  int row_step;
  int mi_cols_sr;
  int mi_col_end_sr;
  int mi_col_sr;
  int step;
  int tpl_stride;
  int mi_high;
  int mi_wide;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int tpl_idx;
  AV1_COMMON *cm;
  int local_b8;
  int local_b0;
  int local_9c;
  long local_98;
  int local_8c;
  int local_7c;
  int local_78;
  
  bVar1 = *(byte *)(in_RDI + 0xe258);
  lVar3 = *in_RDI;
  iVar5 = av1_tpl_stats_ready((TplParams *)(lVar3 + 0xd2a8),(uint)bVar1);
  if (iVar5 != 0) {
    lVar11 = *(long *)(lVar3 + 0x12298) + (long)(int)(uint)bVar1 * 0x60;
    lVar4 = *(long *)(lVar11 + 8);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL];
    iVar5 = *(int *)(lVar11 + 0x40);
    mi_col_00 = 1 << (*(byte *)(lVar3 + 0xd2ac) & 0x1f);
    iVar6 = coded_to_superres_mi(in_ECX,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar7 = coded_to_superres_mi(in_ECX + (uint)bVar1,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar8 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
    iVar9 = coded_to_superres_mi(mi_col_00,(uint)*(byte *)(in_RDI + 0x77fa));
    local_78 = in_EDX;
    while( true ) {
      if ((int)(in_EDX + (uint)bVar2) < *(int *)((long)in_RDI + 0x3c194)) {
        local_b0 = in_EDX + (uint)bVar2;
      }
      else {
        local_b0 = *(int *)((long)in_RDI + 0x3c194);
      }
      local_7c = iVar6;
      if (local_b0 <= local_78) break;
      while( true ) {
        local_b8 = iVar8;
        if (iVar7 < iVar8) {
          local_b8 = iVar7;
        }
        if (local_b8 <= local_7c) break;
        iVar10 = av1_tpl_ptr_pos(local_78,local_7c,iVar5,*(uint8_t *)(lVar3 + 0xd2ac));
        for (local_8c = 0; local_8c < 7; local_8c = local_8c + 1) {
          in_R9[(long)local_8c + 1] =
               *(long *)(lVar4 + (long)iVar10 * 200 + 0x50 + (long)local_8c * 8) +
               in_R9[(long)local_8c + 1];
        }
        local_7c = iVar9 + local_7c;
      }
      local_78 = mi_col_00 + local_78;
    }
    local_98 = 0x7fffffffffffffff;
    for (local_9c = 0; local_9c < 7; local_9c = local_9c + 1) {
      lVar3 = in_R9[(long)local_9c + 1];
      if (((lVar3 != 0) && (lVar3 < local_98)) && (*(int *)(in_R8 + (long)local_9c * 4) != 0)) {
        local_98 = lVar3;
      }
    }
    *in_R9 = local_98;
  }
  return;
}

Assistant:

static inline void get_block_level_tpl_stats(
    AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row, int mi_col, int *valid_refs,
    PruneInfoFromTpl *inter_cost_info_from_tpl) {
  AV1_COMMON *const cm = &cpi->common;

  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  if (!av1_tpl_stats_ready(tpl_data, tpl_idx)) return;
  const TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  const TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int tpl_stride = tpl_frame->stride;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < AOMMIN(mi_row + mi_high, cm->mi_params.mi_rows);
       row += row_step) {
    for (int col = mi_col_sr; col < AOMMIN(mi_col_end_sr, mi_cols_sr);
         col += col_step_sr) {
      const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];

      // Sums up the inter cost of corresponding ref frames
      for (int ref_idx = 0; ref_idx < INTER_REFS_PER_FRAME; ref_idx++) {
        inter_cost_info_from_tpl->ref_inter_cost[ref_idx] +=
            this_stats->pred_error[ref_idx];
      }
    }
  }

  // Computes the best inter cost (minimum inter_cost)
  int64_t best_inter_cost = INT64_MAX;
  for (int ref_idx = 0; ref_idx < INTER_REFS_PER_FRAME; ref_idx++) {
    const int64_t cur_inter_cost =
        inter_cost_info_from_tpl->ref_inter_cost[ref_idx];
    // For invalid ref frames, cur_inter_cost = 0 and has to be handled while
    // calculating the minimum inter_cost
    if (cur_inter_cost != 0 && (cur_inter_cost < best_inter_cost) &&
        valid_refs[ref_idx])
      best_inter_cost = cur_inter_cost;
  }
  inter_cost_info_from_tpl->best_inter_cost = best_inter_cost;
}